

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * sx_replacechar(char *dest,int dest_sz,char *src,char find,char replace)

{
  char *pcVar1;
  char cVar2;
  
  cVar2 = *src;
  if (cVar2 != '\0' && 1 < dest_sz) {
    pcVar1 = src + 1;
    do {
      if (cVar2 == find) {
        cVar2 = replace;
      }
      *dest = cVar2;
      if (dest_sz < 2) break;
      cVar2 = *pcVar1;
      pcVar1 = pcVar1 + 1;
    } while (cVar2 != '\0');
  }
  *dest = '\0';
  return dest;
}

Assistant:

char* sx_replacechar(char* dest, int dest_sz, const char* src, const char find, const char replace)
{
    int dest_max = dest_sz - 1;
    int offset = 0;
    while (*src && offset < dest_max) {
        if (*src != find)
            dest[offset] = *src;
        else
            dest[offset] = replace;
        ++src;
    }
    dest[offset] = '\0';
    return dest;
}